

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O3

void __thiscall NativeEntryPointData::CleanupXDataInfo(NativeEntryPointData *this)

{
  XDataAllocation *xdataInfo;
  
  xdataInfo = (this->xdataInfo).ptr;
  if (xdataInfo != (XDataAllocation *)0x0) {
    Memory::XDataAllocator::Unregister(xdataInfo);
    (this->xdataInfo).ptr = (XDataAllocation *)0x0;
  }
  return;
}

Assistant:

void
NativeEntryPointData::CleanupXDataInfo()
{
    if (this->xdataInfo != nullptr)
    {
        XDataAllocator::Unregister(this->xdataInfo);
#ifdef _WIN32
        if (AutoSystemInfo::Data.IsWin8OrLater())
        {
            // transfers ownership of xdataInfo object
            if(!DelayDeletingFunctionTable::AddEntry(this->xdataInfo))
            {
                DelayDeletingFunctionTable::DeleteFunctionTable(this->xdataInfo);
            }
        }
        else
        {
            HeapDelete(this->xdataInfo);
        }
#endif
        this->xdataInfo = nullptr;
    }
}